

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Playback.cpp
# Opt level: O1

void __thiscall
KDIS::UTILS::DIS_Logger_Playback::DIS_Logger_Playback
          (DIS_Logger_Playback *this,KString *FileName,KUINT16 BufferSz)

{
  std::fstream::fstream(this);
  this->m_ui16PreLoadLines = BufferSz;
  (this->m_qLog).c.
  super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_qLog).c.
  super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_qLog).c.
  super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_qLog).c.
  super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_qLog).c.
  super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_qLog).c.
  super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_qLog).c.
  super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_qLog).c.
  super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_qLog).c.
  super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_qLog).c.
  super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
  ::_M_initialize_map((_Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
                       *)&this->m_qLog,0);
  std::fstream::open((char *)this,(_Ios_Openmode)(FileName->_M_dataplus)._M_p);
  return;
}

Assistant:

DIS_Logger_Playback::DIS_Logger_Playback(  const KString & FileName, KUINT16 BufferSz  ) :
    m_ui16PreLoadLines( BufferSz )
{
    m_File.open( FileName.c_str(), ios::in );
}